

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O1

Precision * icu_63::number::Precision::constructSignificant(int32_t minSig,int32_t maxSig)

{
  Precision *in_RDI;
  
  in_RDI->fType = RND_SIGNIFICANT;
  (in_RDI->fUnion).currencyUsage = ~UCURR_USAGE_STANDARD;
  (in_RDI->fUnion).fracSig.fMinSig = (digits_t)minSig;
  (in_RDI->fUnion).fracSig.fMaxSig = (digits_t)maxSig;
  in_RDI->fRoundingMode = UNUM_FOUND_HALFEVEN;
  return in_RDI;
}

Assistant:

Precision Precision::constructSignificant(int32_t minSig, int32_t maxSig) {
    FractionSignificantSettings settings;
    settings.fMinFrac = -1;
    settings.fMaxFrac = -1;
    settings.fMinSig = static_cast<digits_t>(minSig);
    settings.fMaxSig = static_cast<digits_t>(maxSig);
    PrecisionUnion union_;
    union_.fracSig = settings;
    return {RND_SIGNIFICANT, union_, kDefaultMode};
}